

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_palette_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  uint uVar3;
  uint symb;
  BLOCK_SIZE *in_RDX;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  int palette_uv_mode_ctx;
  int n_1;
  int uv_dc_pred;
  int palette_y_mode_ctx;
  int n;
  int bsize_ctx;
  PALETTE_MODE_INFO *pmi;
  BLOCK_SIZE bsize;
  int num_planes;
  aom_writer *in_stack_00000058;
  int in_stack_00000064;
  PALETTE_MODE_INFO *in_stack_00000068;
  MACROBLOCKD *in_stack_00000070;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar4;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  iVar2 = av1_num_planes(in_RDI);
  av1_get_palette_bsize_ctx(*in_RDX);
  if (in_RDX[2] == BLOCK_4X4) {
    BVar1 = in_RDX[0x8e];
    in_stack_ffffffffffffffc4 = av1_get_palette_mode_ctx(in_RSI);
    aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,
                     (aom_cdf_prob *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
    if (BVar1 != BLOCK_4X4) {
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,
                       (aom_cdf_prob *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffac);
      write_palette_colors_y
                ((MACROBLOCKD *)mbmi,(PALETTE_MODE_INFO *)w,num_planes,(aom_writer *)pmi);
    }
  }
  bVar4 = 0;
  if ((1 < iVar2) && (bVar4 = 0, in_RDX[3] == BLOCK_4X4)) {
    bVar4 = in_RSI->is_chroma_ref;
  }
  uVar3 = (uint)(bVar4 & 1);
  if (uVar3 != 0) {
    symb = (uint)in_RDX[0x8f];
    aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),symb,
                     (aom_cdf_prob *)CONCAT17(bVar4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
    if (0 < (int)symb) {
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),symb,
                       (aom_cdf_prob *)CONCAT17(bVar4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
      write_palette_colors_uv
                (in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058);
    }
  }
  return;
}

Assistant:

static inline void write_palette_mode_info(const AV1_COMMON *cm,
                                           const MACROBLOCKD *xd,
                                           const MB_MODE_INFO *const mbmi,
                                           aom_writer *w) {
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(av1_allow_palette(cm->features.allow_screen_content_tools, bsize));
  const PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);

  if (mbmi->mode == DC_PRED) {
    const int n = pmi->palette_size[0];
    const int palette_y_mode_ctx = av1_get_palette_mode_ctx(xd);
    aom_write_symbol(
        w, n > 0,
        xd->tile_ctx->palette_y_mode_cdf[bsize_ctx][palette_y_mode_ctx], 2);
    if (n > 0) {
      aom_write_symbol(w, n - PALETTE_MIN_SIZE,
                       xd->tile_ctx->palette_y_size_cdf[bsize_ctx],
                       PALETTE_SIZES);
      write_palette_colors_y(xd, pmi, cm->seq_params->bit_depth, w);
    }
  }

  const int uv_dc_pred =
      num_planes > 1 && mbmi->uv_mode == UV_DC_PRED && xd->is_chroma_ref;
  if (uv_dc_pred) {
    const int n = pmi->palette_size[1];
    const int palette_uv_mode_ctx = (pmi->palette_size[0] > 0);
    aom_write_symbol(w, n > 0,
                     xd->tile_ctx->palette_uv_mode_cdf[palette_uv_mode_ctx], 2);
    if (n > 0) {
      aom_write_symbol(w, n - PALETTE_MIN_SIZE,
                       xd->tile_ctx->palette_uv_size_cdf[bsize_ctx],
                       PALETTE_SIZES);
      write_palette_colors_uv(xd, pmi, cm->seq_params->bit_depth, w);
    }
  }
}